

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O3

void __thiscall
absl::str_format_internal::FormatSinkImpl::Append(FormatSinkImpl *this,size_t n,char c)

{
  FormatSinkImpl *pFVar1;
  char *pcVar2;
  FormatSinkImpl *pFVar3;
  FormatSinkImpl *__s;
  FormatSinkImpl *__s_00;
  size_t __n;
  string_view sVar4;
  
  if (n != 0) {
    this->size_ = this->size_ + n;
    pFVar1 = this + 1;
    __s = (FormatSinkImpl *)this->pos_;
    __n = (long)pFVar1 - (long)__s;
    __s_00 = __s;
    if (__n < n) {
      __s_00 = (FormatSinkImpl *)this->buf_;
      do {
        pFVar3 = pFVar1;
        if (pFVar1 != __s) {
          memset(__s,(uint)(byte)c,__n);
          pcVar2 = this->pos_;
          this->pos_ = pcVar2 + __n;
          pFVar3 = (FormatSinkImpl *)(pcVar2 + __n);
        }
        n = n - __n;
        sVar4._M_len = (long)pFVar3 - (long)__s_00;
        sVar4._M_str = (char *)__s_00;
        (*(this->raw_).write_)((this->raw_).sink_,sVar4);
        this->pos_ = (char *)__s_00;
        __n = 0x400;
        __s = __s_00;
      } while (0x400 < n);
    }
    memset(__s_00,(uint)(byte)c,n);
    this->pos_ = this->pos_ + n;
  }
  return;
}

Assistant:

void Append(size_t n, char c) {
    if (n == 0) return;
    size_ += n;
    auto raw_append = [&](size_t count) {
      memset(pos_, c, count);
      pos_ += count;
    };
    while (n > Avail()) {
      n -= Avail();
      if (Avail() > 0) {
        raw_append(Avail());
      }
      Flush();
    }
    raw_append(n);
  }